

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

string * __thiscall
Assimp::FBX::FBXConverter::NameTransformationChainNode
          (string *__return_storage_ptr__,FBXConverter *this,string *name,TransformationComp comp)

{
  char *__rhs;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  TransformationComp local_24;
  string *psStack_20;
  TransformationComp comp_local;
  string *name_local;
  FBXConverter *this_local;
  
  local_24 = comp;
  psStack_20 = name;
  name_local = (string *)this;
  this_local = (FBXConverter *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"_$AssimpFbx$",&local_89);
  std::operator+(&local_68,name,&local_88);
  std::operator+(&local_48,&local_68,"_");
  __rhs = NameTransformationComp(this,local_24);
  std::operator+(__return_storage_ptr__,&local_48,__rhs);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::NameTransformationChainNode(const std::string& name, TransformationComp comp)
        {
            return name + std::string(MAGIC_NODE_TAG) + "_" + NameTransformationComp(comp);
        }